

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O2

void gkc_summary_free(gkc_summary *s)

{
  list *plVar1;
  freelist *pfVar2;
  list *plVar3;
  freelist *__ptr;
  
  plVar3 = (s->head).next;
  while (plVar3 != &s->head) {
    plVar1 = plVar3->next;
    s->alloced = s->alloced - 1;
    plVar3[-2].next = (list *)s->fl;
    s->fl = (freelist *)&plVar3[-2].next;
    plVar3 = plVar1;
  }
  __ptr = s->fl;
  while (__ptr != (freelist *)0x0) {
    pfVar2 = __ptr->next;
    free(__ptr);
    __ptr = pfVar2;
  }
  free(s);
  return;
}

Assistant:

void gkc_summary_free(struct gkc_summary *s)
{
    struct freelist *fl;
    struct list *cur;

    cur = s->head.next;
    while (cur != &s->head) {
        struct list *next;
        next = cur->next;
        gkc_free(s, list_to_tuple(cur));
        cur = next;
    }
    fl = s->fl;
    while (fl) {
        void *p;
        p = fl;
        fl = fl->next;
        free(p);
    }
    free(s);
}